

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterClass.h
# Opt level: O3

void __thiscall CharacterClass::CharacterClass(CharacterClass *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->m_skill_map)._M_t._M_impl.super__Rb_tree_header;
  (this->m_skill_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_skill_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_skill_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_skill_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_skill_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_name,"");
  return;
}

Assistant:

CharacterClass() : m_name("") { }